

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int av1_calc_pframe_target_size_one_pass_cbr(AV1_COMP *cpi,FRAME_UPDATE_TYPE frame_update_type)

{
  uint uVar1;
  AV1_PRIMARY *pAVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  
  pAVar2 = cpi->ppi;
  lVar7 = (pAVar2->p_rc).optimal_buffer_level;
  lVar9 = lVar7 - (pAVar2->p_rc).buffer_level;
  iVar3 = (cpi->rc).avg_frame_bandwidth;
  lVar6 = (long)iVar3;
  iVar3 = iVar3 >> 4;
  iVar10 = 200;
  if (200 < iVar3) {
    iVar10 = iVar3;
  }
  uVar1 = (cpi->oxcf).rc_cfg.gf_cbr_boost_pct;
  lVar5 = lVar6;
  if (uVar1 != 0) {
    if ((frame_update_type == '\x04') || (frame_update_type == '\x02')) {
      iVar3 = (pAVar2->p_rc).baseline_gf_interval;
      lVar5 = (int)(uVar1 + 100) * lVar6 * (long)iVar3;
    }
    else {
      iVar3 = (pAVar2->p_rc).baseline_gf_interval;
      lVar5 = iVar3 * lVar6 * 100;
    }
    lVar5 = lVar5 / (long)(int)(iVar3 * 100 + uVar1);
  }
  if (pAVar2->use_svc != 0) {
    iVar3 = (cpi->svc).layer_context
            [(long)(cpi->svc).temporal_layer_id +
             (long)(cpi->svc).number_temporal_layers * (long)(cpi->svc).spatial_layer_id].
            avg_frame_size;
    lVar5 = (long)iVar3;
    iVar3 = iVar3 >> 4;
    iVar10 = 200;
    if (200 < iVar3) {
      iVar10 = iVar3;
    }
  }
  lVar7 = lVar7 / 100 + 1;
  if (lVar9 < 1) {
    if (-1 < lVar9) goto LAB_0020382a;
    lVar7 = -(lVar9 / lVar7);
    iVar3 = (cpi->oxcf).rc_cfg.over_shoot_pct;
    iVar4 = (int)lVar7;
    if (iVar3 <= lVar7) {
      iVar4 = iVar3;
    }
    lVar7 = SUB168(SEXT816(iVar4 * lVar5) * ZEXT816(0xa3d70a3d70a3d70b),8);
  }
  else {
    lVar9 = lVar9 / lVar7;
    iVar3 = (cpi->oxcf).rc_cfg.under_shoot_pct;
    iVar4 = (int)lVar9;
    if (iVar3 <= lVar9) {
      iVar4 = iVar3;
    }
    lVar7 = SUB168(SEXT816(iVar4 * lVar5) * SEXT816(0x5c28f5c28f5c28f5),8) - iVar4 * lVar5;
  }
  lVar5 = lVar5 + ((lVar7 >> 7) - (lVar7 >> 0x3f));
LAB_0020382a:
  uVar8 = (ulong)(cpi->oxcf).rc_cfg.max_inter_bitrate_pct;
  if ((uVar8 != 0) && (lVar7 = (long)(uVar8 * lVar6) / 100, lVar7 <= lVar5)) {
    lVar5 = lVar7;
  }
  lVar7 = 0x7fffffff;
  if (lVar5 < 0x7fffffff) {
    lVar7 = lVar5;
  }
  iVar3 = (int)lVar7;
  if ((int)lVar7 < iVar10) {
    iVar3 = iVar10;
  }
  return iVar3;
}

Assistant:

int av1_calc_pframe_target_size_one_pass_cbr(
    const AV1_COMP *cpi, FRAME_UPDATE_TYPE frame_update_type) {
  const AV1EncoderConfig *oxcf = &cpi->oxcf;
  const RATE_CONTROL *rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
  const RateControlCfg *rc_cfg = &oxcf->rc_cfg;
  const int64_t diff = p_rc->optimal_buffer_level - p_rc->buffer_level;
  const int64_t one_pct_bits = 1 + p_rc->optimal_buffer_level / 100;
  int min_frame_target =
      AOMMAX(rc->avg_frame_bandwidth >> 4, FRAME_OVERHEAD_BITS);
  int64_t target;

  if (rc_cfg->gf_cbr_boost_pct) {
    const int af_ratio_pct = rc_cfg->gf_cbr_boost_pct + 100;
    if (frame_update_type == GF_UPDATE || frame_update_type == OVERLAY_UPDATE) {
      target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval *
                af_ratio_pct) /
               (p_rc->baseline_gf_interval * 100 + af_ratio_pct - 100);
    } else {
      target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval *
                100) /
               (p_rc->baseline_gf_interval * 100 + af_ratio_pct - 100);
    }
  } else {
    target = rc->avg_frame_bandwidth;
  }
  if (cpi->ppi->use_svc) {
    // Note that for layers, avg_frame_bandwidth is the cumulative
    // per-frame-bandwidth. For the target size of this frame, use the
    // layer average frame size (i.e., non-cumulative per-frame-bw).
    int layer =
        LAYER_IDS_TO_IDX(cpi->svc.spatial_layer_id, cpi->svc.temporal_layer_id,
                         cpi->svc.number_temporal_layers);
    const LAYER_CONTEXT *lc = &cpi->svc.layer_context[layer];
    target = lc->avg_frame_size;
    min_frame_target = AOMMAX(lc->avg_frame_size >> 4, FRAME_OVERHEAD_BITS);
  }
  if (diff > 0) {
    // Lower the target bandwidth for this frame.
    const int pct_low =
        (int)AOMMIN(diff / one_pct_bits, rc_cfg->under_shoot_pct);
    target -= (target * pct_low) / 200;
  } else if (diff < 0) {
    // Increase the target bandwidth for this frame.
    const int pct_high =
        (int)AOMMIN(-diff / one_pct_bits, rc_cfg->over_shoot_pct);
    target += (target * pct_high) / 200;
  }
  if (rc_cfg->max_inter_bitrate_pct) {
    const int64_t max_rate =
        (int64_t)rc->avg_frame_bandwidth * rc_cfg->max_inter_bitrate_pct / 100;
    target = AOMMIN(target, max_rate);
  }
  if (target > INT_MAX) target = INT_MAX;
  return AOMMAX(min_frame_target, (int)target);
}